

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O0

int __thiscall
Indexing::CodeTree::RemovingMatcher<false>::init(RemovingMatcher<false> *this,EVP_PKEY_CTX *ctx)

{
  size_t sVar1;
  size_t in_RCX;
  LitInfo *in_RDX;
  CodeTree *in_R8;
  Stack<Indexing::CodeTree::CodeOp_*> *in_R9;
  RemovingMatcher<false> *this_00;
  
  this->fresh = true;
  this->entry = (CodeOp *)ctx;
  this->linfos = in_RDX;
  this->linfoCnt = in_RCX;
  this->tree = in_R8;
  this->firstsInBlocks = in_R9;
  this_00 = this;
  sVar1 = Lib::Stack<Indexing::CodeTree::CodeOp_*>::size(this->firstsInBlocks);
  this->initFIBDepth = sVar1;
  this->matchingClauses = (bool)(this->tree->_clauseCodeTree & 1);
  Lib::DArray<unsigned_int>::ensure((DArray<unsigned_int> *)this_00,(size_t)ctx);
  Lib::Stack<Indexing::CodeTree::RemovingMatcher<false>::BTPoint>::reset(&this->btStack);
  Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            ((DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x348c57);
  this->curLInfo = 0;
  return (int)this;
}

Assistant:

void CodeTree::RemovingMatcher<checkRange>::init(CodeOp* entry_, LitInfo* linfos_,
    size_t linfoCnt_, CodeTree* tree_, Stack<CodeOp*>* firstsInBlocks_)
{
  fresh=true;
  entry=entry_;
  linfos=linfos_;
  linfoCnt=linfoCnt_;
  tree=tree_;
  firstsInBlocks=firstsInBlocks_;

  initFIBDepth=firstsInBlocks->size();

  matchingClauses=tree->_clauseCodeTree;
  bindings.ensure(tree->_maxVarCnt);
  btStack.reset();
  range.reset();

  curLInfo=0;
}